

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns.c
# Opt level: O3

char * toInternetFormat(char *name)

{
  char cVar1;
  ushort uVar2;
  undefined8 *puVar3;
  undefined8 *__ptr;
  void *pvVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  in_addr_t iVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  char *extraout_RAX;
  DNSRr *pDVar14;
  DNSRr *pDVar15;
  char *pcVar16;
  size_t sVar17;
  void *pvVar18;
  DNSQuery *__src;
  void *pvVar19;
  ushort uVar20;
  ulong unaff_RBX;
  int iVar21;
  DNSRr *unaff_RBP;
  DNSRr *in_RSI;
  DNSRr *pDVar22;
  DNSRr *pDVar23;
  long *plVar24;
  long lVar25;
  char *pcVar26;
  char *name_00;
  ushort *puVar27;
  DNSRr *unaff_R12;
  ulong uVar28;
  DNSRr *unaff_R14;
  char *pcVar29;
  DNSRr *pDVar30;
  ushort *dnsQuery;
  size_t sVar31;
  int iStack_1e4;
  ushort uStack_1e0;
  ushort uStack_1de;
  ushort uStack_1dc;
  ushort uStack_1da;
  void *pvStack_1d8;
  void *pvStack_1d0;
  uint uStack_1c4;
  DNSRr *pDStack_1c0;
  char *pcStack_1b8;
  char *pcStack_1b0;
  char *pcStack_1a8;
  size_t sStack_1a0;
  code *pcStack_198;
  DNSRr *pDStack_188;
  char *pcStack_180;
  char *pcStack_178;
  char *pcStack_170;
  size_t sStack_168;
  code *pcStack_160;
  size_t sStack_150;
  size_t sStack_148;
  char *pcStack_140;
  char *pcStack_138;
  size_t sStack_130;
  code *pcStack_128;
  char *pcStack_118;
  DNSRr *pDStack_110;
  DNSRr *pDStack_108;
  size_t sStack_100;
  char *pcStack_f8;
  char *pcStack_f0;
  DNSRr *pDStack_e8;
  code *pcStack_e0;
  long *plStack_d0;
  DNSRr *pDStack_c8;
  DNSRr *pDStack_c0;
  DNSRr *pDStack_b8;
  DNSRr *pDStack_b0;
  code *pcStack_a8;
  undefined1 auStack_9c [44];
  undefined8 *puStack_70;
  char *pcStack_68;
  ushort auStack_30 [2];
  ushort uStack_2c;
  ushort uStack_2a;
  undefined4 uVar32;
  
  sVar10 = strlen(name);
  pcVar11 = (char *)malloc(sVar10 + 2);
  pcVar29 = (char *)(sVar10 + 1);
  pcVar12 = (char *)malloc((size_t)pcVar29);
  if (pcVar11 == (char *)0x0) {
    toInternetFormat_cold_2();
  }
  else if (pcVar12 != (char *)0x0) {
    strcpy(pcVar12,name);
    sVar10 = strlen(pcVar12);
    if (pcVar12[sVar10 - 1] != '.') {
      sVar10 = strlen(pcVar12);
      (pcVar12 + sVar10)[0] = '.';
      (pcVar12 + sVar10)[1] = '\0';
    }
    pcVar29 = pcVar11;
    if (*pcVar12 != '\0') {
      uVar28 = 0;
      iVar21 = 0;
      do {
        if (pcVar12[uVar28] == '.') {
          *pcVar29 = (char)uVar28 - (char)iVar21;
          pcVar29 = pcVar29 + 1;
          uVar13 = (ulong)iVar21;
          if ((long)uVar13 < (long)uVar28) {
            do {
              *pcVar29 = pcVar12[uVar13];
              uVar13 = uVar13 + 1;
              pcVar29 = pcVar29 + 1;
              iVar21 = (int)uVar28;
            } while (uVar28 != uVar13);
          }
          iVar21 = iVar21 + 1;
        }
        uVar28 = uVar28 + 1;
        sVar10 = strlen(pcVar12);
      } while (uVar28 < sVar10);
    }
    *pcVar29 = '\0';
    free(pcVar12);
    return pcVar11;
  }
  toInternetFormat_cold_1();
  if (pcVar29 != (char *)0x0) {
    return extraout_RAX;
  }
  checkMalloc_cold_1();
  plVar24 = (long *)0x100;
  pcVar11 = (char *)malloc(0x100);
  if (pcVar11 != (char *)0x0) {
    cVar1 = *pcVar29;
    pcVar12 = pcVar11;
    while (cVar1 != '\0') {
      pcVar29 = pcVar29 + 1;
      if ('\0' < cVar1) {
        iVar21 = (int)cVar1;
        do {
          *pcVar12 = *pcVar29;
          pcVar12 = pcVar12 + 1;
          pcVar29 = pcVar29 + 1;
          iVar21 = iVar21 + -1;
        } while (iVar21 != 0);
      }
      *pcVar12 = '.';
      pcVar12 = pcVar12 + 1;
      cVar1 = *pcVar29;
    }
    pcVar12[-1] = '\0';
    return pcVar11;
  }
  toLocalFormat_cold_1();
  *plVar24 = 0xc;
  uVar28 = (ulong)extraout_RAX >> 0x20 & 0xffff;
  auStack_9c._12_8_ = (ulong)extraout_RAX >> 0x30;
  auStack_9c._4_8_ = unaff_RBX >> 0x10 & 0xffff;
  puStack_70 = (undefined8 *)0x0;
  auStack_9c._20_8_ = uVar28;
  pcStack_68 = pcVar29;
  if (uVar28 == 0) {
    pDVar14 = (DNSRr *)(auStack_9c + 0x1c);
    lVar25 = 0xc;
    pDVar23 = unaff_R12;
  }
  else {
    pDVar23 = (DNSRr *)auStack_9c;
    pDVar15 = (DNSRr *)(auStack_9c + 0x1c);
    do {
      pcStack_a8 = (code *)0x102010;
      pDVar14 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar15->name + 0x10) = pDVar14;
      pcStack_a8 = (code *)0x102022;
      in_RSI = pDVar23;
      pcVar29 = serilizeQuery((DNSQuery *)unaff_R12,(int *)pDVar23);
      *(char **)pDVar14->name = pcVar29;
      *(long *)(pDVar14->name + 8) = (long)(int)auStack_9c._0_4_;
      pDVar14->name[0x10] = '\0';
      pDVar14->name[0x11] = '\0';
      pDVar14->name[0x12] = '\0';
      pDVar14->name[0x13] = '\0';
      pDVar14->name[0x14] = '\0';
      pDVar14->name[0x15] = '\0';
      pDVar14->name[0x16] = '\0';
      pDVar14->name[0x17] = '\0';
      lVar25 = (long)(int)auStack_9c._0_4_ + *plVar24;
      *plVar24 = lVar25;
      unaff_R12 = (DNSRr *)&unaff_R12->ttl;
      uVar28 = uVar28 - 1;
      pDVar15 = pDVar14;
    } while (uVar28 != 0);
  }
  pDVar15 = (DNSRr *)0x0;
  if (auStack_9c._12_8_ != 0) {
    pDVar15 = (DNSRr *)auStack_9c;
    uVar28 = auStack_9c._12_8_;
    pDVar30 = pDVar14;
    do {
      pcStack_a8 = (code *)0x102079;
      pDVar14 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar30->name + 0x10) = pDVar14;
      pcStack_a8 = (code *)0x10208b;
      in_RSI = pDVar15;
      pcVar29 = serilizeRr(unaff_R14,(int *)pDVar15);
      *(char **)pDVar14->name = pcVar29;
      *(long *)(pDVar14->name + 8) = (long)(int)auStack_9c._0_4_;
      pDVar14->name[0x10] = '\0';
      pDVar14->name[0x11] = '\0';
      pDVar14->name[0x12] = '\0';
      pDVar14->name[0x13] = '\0';
      pDVar14->name[0x14] = '\0';
      pDVar14->name[0x15] = '\0';
      pDVar14->name[0x16] = '\0';
      pDVar14->name[0x17] = '\0';
      lVar25 = (long)(int)auStack_9c._0_4_ + *plVar24;
      *plVar24 = lVar25;
      unaff_R14 = unaff_R14 + 1;
      uVar28 = uVar28 - 1;
      pDVar23 = unaff_R14;
      pDVar30 = pDVar14;
    } while (uVar28 != 0);
  }
  uVar28 = 0;
  pDVar30 = pDVar14;
  if (auStack_9c._4_8_ != 0) {
    pDVar23 = (DNSRr *)auStack_9c;
    uVar28 = auStack_9c._4_8_;
    do {
      pcStack_a8 = (code *)0x1020de;
      pDVar15 = (DNSRr *)malloc(0x18);
      *(DNSRr **)(pDVar30->name + 0x10) = pDVar15;
      pcStack_a8 = (code *)0x1020f0;
      in_RSI = pDVar23;
      pcVar29 = serilizeRr(unaff_RBP,(int *)pDVar23);
      *(char **)pDVar15->name = pcVar29;
      *(long *)(pDVar15->name + 8) = (long)(int)auStack_9c._0_4_;
      pDVar15->name[0x10] = '\0';
      pDVar15->name[0x11] = '\0';
      pDVar15->name[0x12] = '\0';
      pDVar15->name[0x13] = '\0';
      pDVar15->name[0x14] = '\0';
      pDVar15->name[0x15] = '\0';
      pDVar15->name[0x16] = '\0';
      pDVar15->name[0x17] = '\0';
      lVar25 = (long)(int)auStack_9c._0_4_ + *plVar24;
      *plVar24 = lVar25;
      pDVar14 = unaff_RBP + 1;
      uVar28 = uVar28 - 1;
      unaff_RBP = pDVar14;
      pDVar30 = pDVar15;
    } while (uVar28 != 0);
  }
  pcVar11 = (char *)(lVar25 + 10);
  pcStack_a8 = (code *)0x102123;
  pcVar29 = (char *)malloc((size_t)pcVar11);
  if (pcVar29 != (char *)0x0) {
    auStack_30 = SUB84(extraout_RAX,0);
    uStack_2c = (ushort)auStack_9c._20_8_ << 8 | (ushort)auStack_9c._20_8_ >> 8;
    uStack_2a = (ushort)auStack_9c._12_8_ << 8 | (ushort)auStack_9c._12_8_ >> 8;
    uVar5 = _auStack_30;
    uVar32._0_2_ = (undefined2)unaff_RBX;
    uVar32._2_2_ = (ushort)auStack_9c._4_8_ << 8 | (ushort)auStack_9c._4_8_ >> 8;
    auStack_30[0] = (ushort)extraout_RAX;
    stack0xffffffffffffffd2 = SUB86(uVar5,2);
    auStack_30[0] = auStack_30[0] << 8 | auStack_30[0] >> 8;
    *(undefined4 *)(pcVar29 + 8) = uVar32;
    *(undefined8 *)pcVar29 = _auStack_30;
    pcVar11 = pcVar29 + 0xc;
    __ptr = puStack_70;
    while (__ptr != (undefined8 *)0x0) {
      pvVar18 = (void *)*__ptr;
      sVar10 = __ptr[1];
      pcStack_a8 = (code *)0x102191;
      memcpy(pcVar11,pvVar18,sVar10);
      pcVar11 = pcVar11 + sVar10;
      pcStack_a8 = (code *)0x10219c;
      free(pvVar18);
      puVar3 = (undefined8 *)__ptr[2];
      pcStack_a8 = (code *)0x1021a9;
      free(__ptr);
      __ptr = puVar3;
    }
    *plVar24 = (long)pcVar11 - (long)pcVar29;
    return pcVar29;
  }
  pcStack_a8 = serilizeQuery;
  serilizeDNS_cold_1();
  pcStack_e0 = (code *)0x1021e4;
  pDVar22 = in_RSI;
  plStack_d0 = plVar24;
  pDStack_c8 = pDVar23;
  pDStack_c0 = pDVar15;
  pDStack_b8 = pDVar14;
  pDStack_b0 = pDVar30;
  pcStack_a8 = (code *)uVar28;
  pcVar12 = toInternetFormat(pcVar11);
  pcStack_e0 = (code *)0x1021ef;
  sVar10 = strlen(pcVar12);
  pcVar29 = (char *)(sVar10 + 6);
  pcStack_e0 = (code *)0x1021fb;
  pcVar16 = (char *)malloc((size_t)pcVar29);
  if (pcVar16 != (char *)0x0) {
    pcStack_e0 = (code *)0x10220e;
    strcpy(pcVar16,pcVar12);
    pcStack_e0 = (code *)0x10221c;
    free(pcVar12);
    *(ushort *)(pcVar16 + sVar10 + 1) =
         *(ushort *)(pcVar11 + 0x100) << 8 | *(ushort *)(pcVar11 + 0x100) >> 8;
    *(ushort *)(pcVar16 + sVar10 + 3) =
         *(ushort *)(pcVar11 + 0x102) << 8 | *(ushort *)(pcVar11 + 0x102) >> 8;
    *(int *)in_RSI->name = (int)sVar10 + 5;
    return pcVar16;
  }
  pcStack_e0 = serilizeRr;
  serilizeQuery_cold_1();
  pcStack_128 = (code *)0x10227a;
  pDStack_110 = pDVar22;
  pDStack_108 = in_RSI;
  sStack_100 = sVar10;
  pcStack_f8 = pcVar12;
  pcStack_f0 = pcVar11;
  pDStack_e8 = pDVar30;
  pcStack_e0 = (code *)uVar28;
  pcVar12 = toInternetFormat(pcVar29);
  if (*(short *)(pcVar29 + 0x100) == 1) {
    sVar31 = 4;
  }
  else {
    pcStack_128 = (code *)0x10229c;
    pcStack_118 = toInternetFormat(pcVar29 + 0x10a);
    pcStack_128 = (code *)0x1022a9;
    sVar31 = strlen(pcStack_118);
  }
  pcStack_128 = (code *)0x1022b4;
  sVar17 = strlen(pcVar12);
  iVar21 = (int)sVar31;
  pcVar26 = (char *)((long)iVar21 + sVar17 + 0xe);
  pcStack_128 = (code *)0x1022c7;
  pcVar16 = (char *)malloc((size_t)pcVar26);
  if (pcVar16 != (char *)0x0) {
    pcStack_128 = (code *)0x1022de;
    strcpy(pcVar16,pcVar12);
    pcVar26 = pcVar16 + sVar17;
    pcStack_128 = (code *)0x1022ec;
    free(pcVar12);
    pcVar11 = pcStack_118;
    uVar6 = *(ushort *)(pcVar29 + 0x100);
    *(ushort *)(pcVar16 + sVar17 + 1) = uVar6 << 8 | uVar6 >> 8;
    *(ushort *)(pcVar16 + sVar17 + 3) =
         *(ushort *)(pcVar29 + 0x102) << 8 | *(ushort *)(pcVar29 + 0x102) >> 8;
    uVar9 = *(uint *)(pcVar29 + 0x104);
    *(uint *)(pcVar16 + sVar17 + 5) =
         uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    uVar2 = (ushort)sVar31;
    if (uVar6 == 1) {
      *(ushort *)(pcVar26 + 9) = uVar2 << 8 | uVar2 >> 8;
      pcStack_128 = (code *)0x102364;
      iVar8 = inet_addr(pcVar29 + 0x10a);
      *(in_addr_t *)(pcVar26 + 0xb) = iVar8;
      lVar25 = 0xb;
    }
    else {
      if (uVar6 == 0xf) {
        *(ushort *)(pcVar26 + 9) = (uVar2 + 3) * 0x100 | (ushort)(uVar2 + 3) >> 8;
        pcVar26[0xb] = '\0';
        pcVar26[0xc] = '\x05';
        lVar25 = 0xd;
      }
      else {
        *(ushort *)(pcVar26 + 9) = (uVar2 + 1) * 0x100 | (ushort)(uVar2 + 1) >> 8;
        lVar25 = 0xb;
      }
      pcStack_128 = (code *)0x1023a5;
      memcpy(pcVar26 + lVar25,pcStack_118,(long)(iVar21 + 1));
      pcStack_128 = (code *)0x1023ad;
      free(pcVar11);
    }
    *(int *)pDStack_110->name = (iVar21 + 1 + (int)lVar25 + (int)pcVar26) - (int)pcVar16;
    return pcVar16;
  }
  pcStack_128 = deserilizeQuery;
  serilizeRr_cold_1();
  pcStack_160 = (code *)0x1023ea;
  pDVar14 = pDVar22;
  sStack_150 = sVar17;
  sStack_148 = sVar10;
  pcStack_140 = pcVar29;
  pcStack_138 = pcVar11;
  sStack_130 = sVar31;
  pcStack_128 = (code *)pcVar12;
  pcVar11 = toLocalFormat(pcVar26);
  name_00 = (char *)0x104;
  pcStack_160 = (code *)0x1023f7;
  pcVar16 = (char *)malloc(0x104);
  if (pcVar16 != (char *)0x0) {
    pcStack_160 = (code *)0x10240a;
    strcpy(pcVar16,pcVar11);
    pcStack_160 = (code *)0x102412;
    sVar10 = strlen(pcVar26);
    pcStack_160 = (code *)0x102421;
    free(pcVar11);
    *(ushort *)(pcVar16 + 0x100) =
         *(ushort *)(pcVar26 + sVar10 + 1) << 8 | *(ushort *)(pcVar26 + sVar10 + 1) >> 8;
    *(ushort *)(pcVar16 + 0x102) =
         *(ushort *)(pcVar26 + sVar10 + 3) << 8 | *(ushort *)(pcVar26 + sVar10 + 3) >> 8;
    *(int *)pDVar22->name = (int)sVar10 + 5;
    return pcVar16;
  }
  pcStack_160 = deserilizeRr;
  deserilizeQuery_cold_1();
  pcStack_198 = (code *)0x10247a;
  pDVar23 = pDVar14;
  pDStack_188 = pDVar22;
  pcStack_180 = pcVar11;
  pcStack_178 = pcVar29;
  pcStack_170 = pcVar26;
  sStack_168 = sVar31;
  pcStack_160 = (code *)pcVar12;
  pcVar29 = toLocalFormat(name_00);
  puVar27 = (ushort *)0x20e;
  pcStack_198 = (code *)0x102487;
  pcVar16 = (char *)malloc(0x20e);
  if (pcVar16 == (char *)0x0) {
    pcStack_198 = deserializeDNS;
    deserilizeRr_cold_1();
    if (((DNSRr *)0xb < pDVar23) && (uStack_1c4 = (uint)puVar27[1], (puVar27[1] & 0x7078) == 0)) {
      uStack_1da = puVar27[4];
      dnsQuery = puVar27 + 6;
      pvStack_1d0 = (void *)CONCAT62(pvStack_1d0._2_6_,puVar27[5]);
      uVar6 = puVar27[3];
      uVar2 = *puVar27;
      uVar7 = puVar27[2];
      uVar20 = uVar7 << 8 | uVar7 >> 8;
      uStack_1dc = uVar20;
      pDStack_1c0 = pDVar14;
      pcStack_1b8 = pcVar11;
      pcStack_1b0 = pcVar29;
      pcStack_1a8 = name_00;
      sStack_1a0 = sVar31;
      pcStack_198 = (code *)pcVar12;
      if (uVar7 == 0) {
        pvVar18 = (void *)0x0;
      }
      else {
        pvStack_1d8 = (void *)CONCAT62(pvStack_1d8._2_6_,uVar6);
        pvVar18 = malloc((ulong)uVar20 * 0x100 + (ulong)uVar20 * 4);
        uVar9 = 1;
        if (1 < uVar20) {
          uVar9 = (uint)uVar20;
        }
        lVar25 = 0;
        do {
          __src = deserilizeQuery((char *)dnsQuery,&iStack_1e4);
          memcpy((void *)((long)pvVar18 + lVar25),__src,0x104);
          dnsQuery = (ushort *)((long)iStack_1e4 + (long)dnsQuery);
          free(__src);
          lVar25 = lVar25 + 0x104;
        } while ((ulong)(uVar9 << 8) + (ulong)uVar9 * 4 != lVar25);
        uVar6 = (ushort)pvStack_1d8;
      }
      uVar7 = uVar6 << 8 | uVar6 >> 8;
      uStack_1de = uVar7;
      pvStack_1d8 = pvVar18;
      if (uVar6 == 0) {
        pvVar18 = (void *)0x0;
      }
      else {
        pvVar18 = malloc((ulong)uVar7 * 0x20c);
        uVar6 = 1;
        if (1 < uVar7) {
          uVar6 = uVar7;
        }
        lVar25 = 0;
        do {
          pDVar14 = deserilizeRr((char *)dnsQuery,&iStack_1e4);
          memcpy((void *)((long)pvVar18 + lVar25),pDVar14,0x20c);
          dnsQuery = (ushort *)((long)iStack_1e4 + (long)dnsQuery);
          free(pDVar14);
          lVar25 = lVar25 + 0x20c;
        } while ((ulong)uVar6 * 0x20c - lVar25 != 0);
      }
      uVar6 = (ushort)pvStack_1d0 << 8 | (ushort)pvStack_1d0 >> 8;
      if ((ushort)pvStack_1d0 == 0) {
        pvVar19 = (void *)0x0;
      }
      else {
        uStack_1e0 = uVar6;
        pvStack_1d0 = pvVar18;
        pvVar19 = malloc((ulong)uVar6 * 0x20c);
        uVar7 = 1;
        if (1 < uVar6) {
          uVar7 = uVar6;
        }
        lVar25 = 0;
        do {
          pDVar14 = deserilizeRr((char *)dnsQuery,&iStack_1e4);
          memcpy((void *)((long)pvVar19 + lVar25),pDVar14,0x20c);
          dnsQuery = (ushort *)((long)dnsQuery + (long)iStack_1e4);
          free(pDVar14);
          lVar25 = lVar25 + 0x20c;
          pvVar18 = pvStack_1d0;
          uVar6 = uStack_1e0;
        } while ((ulong)uVar7 * 0x20c - lVar25 != 0);
      }
      pvVar4 = pvStack_1d8;
      puVar27 = (ushort *)malloc(0x30);
      *puVar27 = uVar2 << 8 | uVar2 >> 8;
      puVar27[1] = (ushort)uStack_1c4;
      puVar27[2] = uStack_1dc;
      puVar27[3] = uStack_1de;
      puVar27[4] = uStack_1da;
      puVar27[5] = uVar6;
      puVar27[6] = 0;
      puVar27[7] = 0;
      *(void **)(puVar27 + 8) = pvVar4;
      *(void **)(puVar27 + 0xc) = pvVar18;
      puVar27[0x10] = 0;
      puVar27[0x11] = 0;
      puVar27[0x12] = 0;
      puVar27[0x13] = 0;
      *(void **)(puVar27 + 0x14) = pvVar19;
      return (char *)puVar27;
    }
    return (char *)0x0;
  }
  pcStack_198 = (code *)0x10249e;
  strcpy(pcVar16,pcVar29);
  pcStack_198 = (code *)0x1024a6;
  sVar10 = strlen(name_00);
  pcVar11 = name_00 + sVar10;
  pcStack_198 = (code *)0x1024b5;
  free(pcVar29);
  uVar6 = *(ushort *)(name_00 + sVar10 + 1) << 8 | *(ushort *)(name_00 + sVar10 + 1) >> 8;
  *(ushort *)(pcVar16 + 0x100) = uVar6;
  *(ushort *)(pcVar16 + 0x102) =
       *(ushort *)(name_00 + sVar10 + 3) << 8 | *(ushort *)(name_00 + sVar10 + 3) >> 8;
  uVar9 = *(uint *)(name_00 + sVar10 + 5);
  *(uint *)(pcVar16 + 0x104) =
       uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  *(ushort *)(pcVar16 + 0x108) =
       *(ushort *)(name_00 + sVar10 + 9) << 8 | *(ushort *)(name_00 + sVar10 + 9) >> 8;
  if (uVar6 == 0xf) {
    pcStack_198 = (code *)0x102540;
    pcVar29 = toLocalFormat(pcVar11 + 0xd);
    pcStack_198 = (code *)0x10254b;
    strcpy(pcVar16 + 0x10a,pcVar29);
    pcStack_198 = (code *)0x102553;
    sVar10 = strlen(pcVar11 + 0xd);
    iVar21 = (int)pcVar11 + (int)sVar10 + 0xe;
  }
  else if (uVar6 == 1) {
    pcStack_198 = (code *)0x102519;
    pcVar29 = inet_ntoa((in_addr)*(in_addr_t *)(pcVar11 + 0xb));
    pcStack_198 = (code *)0x102524;
    strcpy(pcVar16 + 0x10a,pcVar29);
    iVar21 = (int)pcVar11 + 0xf;
  }
  else {
    pcVar11 = name_00 + sVar10 + 0xb;
    pcStack_198 = (code *)0x102575;
    pcVar29 = toLocalFormat(pcVar11);
    pcStack_198 = (code *)0x102580;
    strcpy(pcVar16 + 0x10a,pcVar29);
    pcStack_198 = (code *)0x102588;
    sVar10 = strlen(pcVar11);
    iVar21 = (int)pcVar11 + (int)sVar10 + 1;
  }
  *(int *)pDVar14->name = iVar21 - (int)name_00;
  return pcVar16;
}

Assistant:

char *toInternetFormat(char *name)
{
    char *result = (char *) malloc(strlen(name) + 2);
    char *domain = (char *) malloc(strlen(name) + 1);
    checkMalloc(result);
    checkMalloc(domain);

    strcpy(domain, name);
    char *dns = result;
    int lock = 0;

    // 尾部补 “.”
    if (domain[strlen((char *) domain) - 1] != '.')
        strcat((char *) domain, ".");

    for (int i = 0; i < strlen((char *) domain); i++)
    {
        if (domain[i] == '.')
        {
            *dns++ = i - lock;
            for (; lock < i; lock++)
            {
                *dns++ = domain[lock];
            }
            lock++;
        }
    }
    *dns++ = '\0';

    free(domain);

    return result;
}